

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

QStringList * __thiscall
QSQLiteDriver::tables(QStringList *__return_storage_ptr__,QSQLiteDriver *this,TableType type)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  QSqlResult *pQVar6;
  int iVar7;
  QChar QVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QAnyStringView QVar10;
  QByteArrayView QVar11;
  QSqlQuery q;
  QString local_98;
  QArrayData *local_78;
  char16_t *pcStack_70;
  undefined1 *local_68;
  undefined1 local_60 [8];
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  cVar5 = (**(code **)(*(long *)this + 0x60))(this);
  if (cVar5 == '\0') goto LAB_00115d61;
  local_60 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = (QSqlResult *)(**(code **)(*(long *)this + 200))(this);
  QSqlQuery::QSqlQuery((QSqlQuery *)local_60,pQVar6);
  QSqlQuery::setForwardOnly(SUB81((QSqlQuery *)local_60,0));
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_70 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QVar9.m_data = (storage_type_conflict *)0x5e;
  QVar9.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar9);
  local_78 = (QArrayData *)local_58.d.data.shared;
  pcStack_70 = (char16_t *)local_58.d.data._8_8_;
  local_68 = (undefined1 *)local_58.d.data._16_8_;
  if ((~type & 5) == 0) {
    QVar8.ucs = L'\x1b';
    iVar7 = 0x20150b;
LAB_00115bca:
    QVar10.m_size = (size_t)&local_78;
    QVar10.field_0.m_data = &local_58;
    QString::arg_impl(QVar10,iVar7,QVar8);
    uVar4 = local_58.d.data._16_8_;
    uVar3 = local_58.d.data.shared;
    pcVar2 = pcStack_70;
    pQVar1 = local_78;
    local_58.d.data.shared = (PrivateShared *)local_78;
    local_78 = (QArrayData *)uVar3;
    pcStack_70 = (char16_t *)local_58.d.data._8_8_;
    local_58.d.data._8_8_ = pcVar2;
    local_58.d.data._16_8_ = local_68;
    local_68 = (undefined1 *)uVar4;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
LAB_00115c1e:
        QArrayData::deallocate((QArrayData *)local_58.d.data.shared,2,0x10);
      }
    }
  }
  else {
    if ((type & Tables) != 0) {
      QVar8.ucs = L'\f';
      iVar7 = 0x201527;
      goto LAB_00115bca;
    }
    if ((type & Views) != 0) {
      QVar8.ucs = L'\v';
      iVar7 = 0x20151b;
      goto LAB_00115bca;
    }
    if ((char16_t *)local_58.d.data._8_8_ != (char16_t *)0x0) {
      local_78 = (QArrayData *)0x0;
      pcStack_70 = (char16_t *)0x0;
      local_68 = (undefined1 *)0x0;
      if ((QArrayData *)local_58.d.data.shared == (QArrayData *)0x0) goto LAB_00115c2d;
      LOCK();
      *(int *)local_58.d.data.shared = *(int *)local_58.d.data.shared + -1;
      UNLOCK();
      if (*(int *)local_58.d.data.shared != 0) goto LAB_00115c2d;
      goto LAB_00115c1e;
    }
  }
LAB_00115c2d:
  if (((local_68 != (undefined1 *)0x0) &&
      (cVar5 = QSqlQuery::exec((QString *)local_60), cVar5 != '\0')) &&
     (cVar5 = QSqlQuery::next(), cVar5 != '\0')) {
    do {
      QSqlQuery::value((int)&local_58);
      QVariant::toString();
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_98);
      QList<QString>::end(__return_storage_ptr__);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      QVariant::~QVariant(&local_58);
      cVar5 = QSqlQuery::next();
    } while (cVar5 != '\0');
  }
  if ((type & SystemTables) != 0) {
    QVar11.m_data = (storage_type_conflict *)0xd;
    QVar11.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar11);
    local_98.d.d = (Data *)local_58.d.data.shared;
    local_98.d.ptr = (char16_t *)local_58.d.data._8_8_;
    local_98.d.size = local_58.d.data._16_8_;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &local_98);
    QList<QString>::end(__return_storage_ptr__);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  QSqlQuery::~QSqlQuery((QSqlQuery *)local_60);
LAB_00115d61:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QSQLiteDriver::tables(QSql::TableType type) const
{
    QStringList res;
    if (!isOpen())
        return res;

    QSqlQuery q(createResult());
    q.setForwardOnly(true);

    QString sql = "SELECT name FROM sqlite_master WHERE %1 "
                  "UNION ALL SELECT name FROM sqlite_temp_master WHERE %1"_L1;
    if ((type & QSql::Tables) && (type & QSql::Views))
        sql = sql.arg("type='table' OR type='view'"_L1);
    else if (type & QSql::Tables)
        sql = sql.arg("type='table'"_L1);
    else if (type & QSql::Views)
        sql = sql.arg("type='view'"_L1);
    else
        sql.clear();

    if (!sql.isEmpty() && q.exec(sql)) {
        while(q.next())
            res.append(q.value(0).toString());
    }

    if (type & QSql::SystemTables) {
        // there are no internal tables beside this one:
        res.append("sqlite_master"_L1);
    }

    return res;
}